

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O3

int omp_quiesce(omp_thread_state_t quiesce_state)

{
  __kmp_internal_end_fini();
  return 0;
}

Assistant:

int FTN_STDCALL
FTN_QUIESCE( omp_thread_state_t quiesce_state )
{
    //printf("runtime quiesce call\n");
    __kmp_internal_end_fini();
    // int a = __kmp_gtid_get_specific();
    // printf("gid %d*********", a);
    // __kmp_internal_end_thread( -1 ); // seems doesn't work
    // void *exit_val;
    // kmp_info_t * thread = __kmp_threads[2];
    // pthread_kill(2, 0 );
    // __kmp_reap_worker( thread );
    // __kmp_reap_team( thread->th.th_serial_team );
    // thread->th.th_serial_team = NULL;
    // __kmp_free( thread );
    // KMP_MB();
    // pthread_join( thread->th.th_info.ds.ds_thread, & exit_val);
    // printf("done\n");

    // __kmp_cleanup();
    // __kmp_free( __kmp_threads );
    // a = __kmp_gtid_get_specific();
    // printf("gid %d*********", a);
    // __kmp_unregister_root_current_thread(0);
    // KMP_MB();
    // __kmp_global.g.g_abort = -1;
    // TCW_SYNC_4(__kmp_global.g.g_done, TRUE);
    return 0;
}